

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_utf_encode(nk_rune u,char *c,int clen)

{
  char cVar1;
  int i_00;
  int local_24;
  int i;
  int len;
  int clen_local;
  char *c_local;
  nk_rune u_local;
  
  c_local._0_4_ = u;
  i_00 = nk_utf_validate((nk_rune *)&c_local,0);
  if (((clen < i_00) || (i_00 == 0)) || (local_24 = i_00, 4 < i_00)) {
    c_local._4_4_ = 0;
  }
  else {
    while (local_24 = local_24 + -1, local_24 != 0) {
      cVar1 = nk_utf_encode_byte((nk_rune)c_local,0);
      c[local_24] = cVar1;
      c_local._0_4_ = (nk_rune)c_local >> 6;
    }
    cVar1 = nk_utf_encode_byte((nk_rune)c_local,i_00);
    *c = cVar1;
    c_local._4_4_ = i_00;
  }
  return c_local._4_4_;
}

Assistant:

NK_API int
nk_utf_encode(nk_rune u, char *c, int clen)
{
    int len, i;
    len = nk_utf_validate(&u, 0);
    if (clen < len || !len || len > NK_UTF_SIZE)
        return 0;

    for (i = len - 1; i != 0; --i) {
        c[i] = nk_utf_encode_byte(u, 0);
        u >>= 6;
    }
    c[0] = nk_utf_encode_byte(u, len);
    return len;
}